

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_srcs.cxx
# Opt level: O1

void __thiscall xray_re::xr_sound_src_object::load(xr_sound_src_object *this,xr_reader *r)

{
  float *pfVar1;
  undefined8 in_RAX;
  size_t sVar2;
  float fVar3;
  uint16_t version;
  short local_12;
  
  local_12 = (short)((ulong)in_RAX >> 0x30);
  sVar2 = xr_reader::r_raw_chunk(r,0x1001,&local_12,2);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_srcs.cxx"
                  ,0x1a,"virtual void xray_re::xr_sound_src_object::load(xr_reader &)");
  }
  if (local_12 != 0x14) {
    __assert_fail("version == SOUNDSRC_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_srcs.cxx"
                  ,0x1b,"virtual void xray_re::xr_sound_src_object::load(xr_reader &)");
  }
  xr_custom_object::load(&this->super_xr_custom_object,r);
  sVar2 = xr_reader::r_raw_chunk(r,0x1002,&this->m_type,1);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_srcs.cxx"
                  ,0x1e,"virtual void xray_re::xr_sound_src_object::load(xr_reader &)");
  }
  sVar2 = xr_reader::find_chunk(r,0x1003);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_srcs.cxx"
                  ,0x20,"virtual void xray_re::xr_sound_src_object::load(xr_reader &)");
  }
  xr_reader::r_sz(r,&this->m_source_name);
  sVar2 = xr_reader::find_chunk(r,0x1007);
  if (sVar2 == 0) {
    sVar2 = xr_reader::find_chunk(r,0x1006);
    if (sVar2 == 0) {
      sVar2 = xr_reader::find_chunk(r,0x1004);
      if (sVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_srcs.cxx"
                      ,0x35,"virtual void xray_re::xr_sound_src_object::load(xr_reader &)");
      }
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      (this->m_sound_pos).field_0.field_0.x = *pfVar1;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      (this->m_sound_pos).field_0.field_0.y = *pfVar1;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      (this->m_sound_pos).field_0.field_0.z = *pfVar1;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      this->m_volume = *pfVar1;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      this->m_frequency = *pfVar1;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      this->m_min_dist = *pfVar1;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      fVar3 = *pfVar1;
      this->m_max_dist = fVar3;
      goto LAB_0018f248;
    }
  }
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  (this->m_sound_pos).field_0.field_0.x = *pfVar1;
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  (this->m_sound_pos).field_0.field_0.y = *pfVar1;
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  (this->m_sound_pos).field_0.field_0.z = *pfVar1;
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  this->m_volume = *pfVar1;
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  this->m_frequency = *pfVar1;
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  this->m_min_dist = *pfVar1;
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  this->m_max_dist = *pfVar1;
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  fVar3 = *pfVar1;
LAB_0018f248:
  this->m_max_ai_dist = fVar3;
  xr_reader::r_raw_chunk(r,0x1005,&(this->super_xr_custom_object).field_0x6c,4);
  sVar2 = xr_reader::find_chunk(r,0x1008);
  if (sVar2 != 0) {
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->m_pause_time).field_0.field_0.x = *pfVar1;
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->m_pause_time).field_0.field_0.y = *pfVar1;
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->m_active_time).field_0.field_0.x = *pfVar1;
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->m_active_time).field_0.field_0.y = *pfVar1;
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->m_play_time).field_0.field_0.x = *pfVar1;
    pfVar1 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
    (this->m_play_time).field_0.field_0.y = *pfVar1;
  }
  return;
}

Assistant:

void xr_sound_src_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SOUNDSRC_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SOUNDSRC_VERSION);
	xr_custom_object::load(r);
	if (!r.r_chunk<uint8_t>(SOUNDSRC_CHUNK_TYPE, m_type))
		xr_not_expected();
	if (!r.find_chunk(SOUNDSRC_CHUNK_SOURCE_NAME))
		xr_not_expected();
	r.r_sz(m_source_name);
	r.debug_find_chunk();
	if (r.find_chunk(SOUNDSRC_CHUNK_PARAMS_2) ||
			r.find_chunk(SOUNDSRC_CHUNK_PARAMS_1)) {
		r.r_fvector3(m_sound_pos);
		m_volume = r.r_float();
		m_frequency = r.r_float();
		m_min_dist = r.r_float();
		m_max_dist = r.r_float();
		m_max_ai_dist = r.r_float();
		r.debug_find_chunk();
	} else if (r.find_chunk(SOUNDSRC_CHUNK_PARAMS_0)) {
		r.r_fvector3(m_sound_pos);
		m_volume = r.r_float();
		m_frequency = r.r_float();
		m_min_dist = r.r_float();
		m_max_dist = r.r_float();
		m_max_ai_dist = m_max_dist;
		r.debug_find_chunk();
	} else {
		xr_not_expected();
	}
	r.r_chunk<uint32_t>(SOUNDSRC_CHUNK_FLAGS, m_flags);
	if (r.find_chunk(SOUNDSRC_CHUNK_TIME)) {
		r.r_fvector2(m_pause_time);
		r.r_fvector2(m_active_time);
		r.r_fvector2(m_play_time);
		r.debug_find_chunk();
	}
}